

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::HandleMissingTarget
          (cmExportBuildFileGenerator *this,string *link_libs,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee)

{
  string *psVar1;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *gg_00;
  size_type sVar2;
  string local_108;
  int local_e4;
  string local_e0;
  undefined1 local_c0 [8];
  string missingTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exportFiles;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exportInfo;
  cmGlobalGenerator *gg;
  string name;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  string *link_libs_local;
  cmExportBuildFileGenerator *this_local;
  
  name.field_2._8_8_ = dependee;
  if (((this->super_cmExportFileGenerator).AppendMode & 1U) == 0) {
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    std::__cxx11::string::string((string *)&gg,(string *)psVar1);
    this_00 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)name.field_2._8_8_);
    gg_00 = cmLocalGenerator::GetGlobalGenerator(this_00);
    FindBuildExportInfo((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&exportFiles,this,gg_00,(string *)&gg);
    missingTarget.field_2._8_8_ = &exportFiles;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)missingTarget.field_2._8_8_);
    if (sVar2 == 1) {
      std::__cxx11::string::string
                ((string *)local_c0,
                 (string *)
                 &exportInfo.first.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_e0,(cmGeneratorTarget *)name.field_2._8_8_)
      ;
      std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::operator+=((string *)link_libs,(string *)local_c0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->super_cmExportFileGenerator).MissingTargets,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      local_e4 = 1;
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      ComplainAboutMissingTarget
                (this,depender,(cmGeneratorTarget *)name.field_2._8_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)missingTarget.field_2._8_8_);
      local_e4 = 0;
    }
    std::
    pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&exportFiles);
    std::__cxx11::string::~string((string *)&gg);
    if (local_e4 != 0) {
      return;
    }
  }
  std::__cxx11::string::operator+=
            ((string *)link_libs,(string *)&(this->super_cmExportFileGenerator).Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_108,(cmGeneratorTarget *)name.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)link_libs,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

void cmExportBuildFileGenerator::HandleMissingTarget(
  std::string& link_libs, cmGeneratorTarget const* depender,
  cmGeneratorTarget* dependee)
{
  // The target is not in the export.
  if (!this->AppendMode) {
    const std::string name = dependee->GetName();
    cmGlobalGenerator* gg =
      dependee->GetLocalGenerator()->GetGlobalGenerator();
    auto exportInfo = this->FindBuildExportInfo(gg, name);
    std::vector<std::string> const& exportFiles = exportInfo.first;

    if (exportFiles.size() == 1) {
      std::string missingTarget = exportInfo.second;

      missingTarget += dependee->GetExportName();
      link_libs += missingTarget;
      this->MissingTargets.emplace_back(std::move(missingTarget));
      return;
    }
    // We are not appending, so all exported targets should be
    // known here.  This is probably user-error.
    this->ComplainAboutMissingTarget(depender, dependee, exportFiles);
  }
  // Assume the target will be exported by another command.
  // Append it with the export namespace.
  link_libs += this->Namespace;
  link_libs += dependee->GetExportName();
}